

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O1

void stressing_single_thread(void)

{
  int v;
  Logger local_ff8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----------stressing test single thread-----------",0x31);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  v = 0;
  do {
    tt::Logger::Logger(&local_ff8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/tests/LoggingTest.cpp"
                       ,0x30);
    tt::LogStream::operator<<((LogStream *)&local_ff8,v);
    tt::Logger::~Logger(&local_ff8);
    v = v + 1;
  } while (v != 100000);
  return;
}

Assistant:

void stressing_single_thread()
{
    // 100000 lines
    cout << "----------stressing test single thread-----------" << endl;
    for (int i = 0; i < 100000; ++i)
    {
        LOG << i;
    }
}